

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O3

iterator __thiscall
fmt::v10::
formatter<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>,char,void>
::format<fmt::v10::basic_format_context<fmt::v10::appender,char>>
          (formatter<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,char,void>
           *this,CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *m,basic_format_context<fmt::v10::appender,_char> *ctx)

{
  int _precision;
  appender __result;
  basic_format_context<fmt::v10::appender,_char> *pbVar1;
  string local_470;
  string local_450;
  basic_format_context<fmt::v10::appender,_char> *local_430;
  string local_428;
  string local_408;
  string local_3e8;
  __string_type str;
  IOFormat local_398;
  stringstream ss;
  ostream local_298 [112];
  ios_base local_228 [264];
  IOFormat format;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  _precision = *(int *)this;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,", ","");
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"\n","");
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"[","");
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"]","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  local_430 = ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"");
  Eigen::IOFormat::IOFormat
            (&format,_precision,0,&str,&local_450,&local_470,&local_408,&local_428,&local_3e8,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  pbVar1 = local_430;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_string_length = (m->m_lhs).m_rows.m_value;
  str.field_2._8_8_ = (m->m_lhs).m_functor.m_other;
  Eigen::IOFormat::IOFormat(&local_398,&format);
  Eigen::operator<<(local_298,
                    (WithFormat<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&str);
  Eigen::IOFormat::~IOFormat(&local_398);
  __result.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (pbVar1->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  std::__cxx11::stringbuf::str();
  std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char*,fmt::v10::appender>
            (str._M_dataplus._M_p,str._M_dataplus._M_p + str._M_string_length,__result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  Eigen::IOFormat::~IOFormat(&format);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_228);
  return (iterator)
         (buffer<char> *)
         __result.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

auto format(const MATRIX& m, FormatContext& ctx) const {
    std::stringstream ss;  // NOLINT(misc-const-correctness)
    const Eigen::IOFormat format(precision, 0, ", ", "\n", "[", "]");
    ss << m.format(format);

    auto it = ctx.out();
    auto str = ss.str();
    std::copy(str.begin(), str.end(), it);
    return it;
  }